

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::compare_not_equal(Simulator *this,PCode *code)

{
  deque<StackSymbol,_std::allocator<StackSymbol>_> *this_00;
  _Elt_pointer pSVar1;
  StackSymbol left;
  StackSymbol right;
  StackSymbol local_f0;
  StackSymbol local_a8;
  StackSymbol local_60;
  
  this_00 = &this->stack_;
  pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&local_60,pSVar1 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&local_a8,pSVar1 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  if (local_a8.type_ == kInt) {
    if (local_60.type_ == kInt) {
      local_f0.type_ = kInt;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.value_.int_value = (int)(local_a8.value_.int_value != local_60.value_.int_value);
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
                (this_00,&local_f0);
    }
    else {
      local_f0.type_ = kInt;
      local_f0.value_.int_value =
           -(uint)((double)local_a8.value_.int_value != local_60.value_.real_value) & 1;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
                (this_00,&local_f0);
    }
  }
  else if (local_60.type_ == kInt) {
    local_f0.type_ = kInt;
    local_f0.value_.int_value =
         -(uint)((double)local_60.value_.int_value != local_a8.value_.real_value) & 1;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (this_00,&local_f0);
  }
  else {
    local_f0.type_ = kInt;
    local_f0.value_.int_value =
         -(uint)(local_60.value_.real_value != local_a8.value_.real_value) & 1;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (this_00,&local_f0);
  }
  StackSymbol::UnionValue::~UnionValue(&local_f0.value_);
  this->eip_ = this->eip_ + 1;
  StackSymbol::UnionValue::~UnionValue(&local_a8.value_);
  StackSymbol::UnionValue::~UnionValue(&local_60.value_);
  return;
}

Assistant:

void Simulator::compare_not_equal(const PCode &code) {
    StackSymbol right = stack_.back();
    stack_.pop_back();
    StackSymbol left = stack_.back();
    stack_.pop_back();

    if (left.type() == StackSymbol::Type::kInt) {
        if (right.type() == StackSymbol::Type::kInt) {
            stack_.push_back(StackSymbol((int)(left.int_value() != right.int_value())));
        } else {
            stack_.push_back(StackSymbol((int)((double)left.int_value() != right.real_value())));
        }
    } else {
        if (right.type() == StackSymbol::Type::kInt) {
            stack_.push_back(StackSymbol((int)(left.real_value() != (double)right.int_value())));
        } else {
            stack_.push_back(StackSymbol((int)(left.real_value() != right.real_value())));
        }
    }

    inc_eip();
}